

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::
HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
::Grow(HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
       *this)

{
  size_t sVar1;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar2;
  pair<pbrt::LightHandle,_unsigned_long> *ppVar3;
  uint64_t uVar4;
  int iVar5;
  ulong uVar6;
  size_t i;
  size_t sVar7;
  ulong uVar8;
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  newTable;
  polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_> local_38;
  
  sVar1 = (this->table).nStored;
  uVar6 = sVar1 * 2;
  local_38.memoryResource = (this->table).alloc.memoryResource;
  sVar7 = 0x40;
  if (0x40 < uVar6) {
    sVar7 = uVar6;
  }
  pstd::
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  ::vector(&newTable,sVar7,&local_38);
  for (sVar7 = 0; sVar7 != sVar1; sVar7 = sVar7 + 1) {
    poVar2 = (this->table).ptr;
    if (poVar2[sVar7].set == true) {
      ppVar3 = pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>::value(poVar2 + sVar7);
      uVar4 = Hash<void*>((void *)((ppVar3->first).
                                   super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                                   .bits & 0xffffffffffff));
      uVar6 = 0;
      do {
        iVar5 = (int)uVar6;
        uVar8 = uVar6 >> 1;
        uVar6 = (ulong)(iVar5 + 1);
        uVar8 = (ulong)((uint)(iVar5 * iVar5) >> 1) + uVar8 + (uVar4 & newTable.nStored - 1) &
                newTable.nStored - 1;
      } while (newTable.ptr[uVar8].set != false);
      ppVar3 = pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>::value
                         ((this->table).ptr + sVar7);
      pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>::operator=
                (newTable.ptr + uVar8,ppVar3);
    }
  }
  pstd::
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  ::operator=(&this->table,&newTable);
  pstd::
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  ::~vector(&newTable);
  return;
}

Assistant:

void Grow() {
        size_t currentCapacity = capacity();
        pstd::vector<TableEntry> newTable(std::max<size_t>(64, 2 * currentCapacity),
                                          table.get_allocator());
        size_t newCapacity = newTable.size();
        for (size_t i = 0; i < currentCapacity; ++i) {
            // Insert _table[i]_ into _newTable_ if it is set
            if (!table[i].has_value())
                continue;
            size_t baseOffset = Hash()(table[i]->first) & (newCapacity - 1);
            for (int nProbes = 0;; ++nProbes) {
                size_t offset = (baseOffset + nProbes / 2 + nProbes * nProbes / 2) &
                                (newCapacity - 1);
                if (!newTable[offset]) {
                    newTable[offset] = std::move(*table[i]);
                    break;
                }
            }
        }
        table = std::move(newTable);
    }